

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_Vec2Offset
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dx;
  double dy;
  int iVar1;
  DObject *this;
  VMValue *pVVar2;
  bool bVar3;
  bool local_6b;
  undefined1 local_68 [8];
  DVector2 u;
  bool absolute;
  double y;
  double x;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e71,
                  "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e71,
                  "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = *(DObject **)&param->field_0;
  local_6b = true;
  if (this != (DObject *)0x0) {
    local_6b = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_6b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e71,
                  "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e72,
                  "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e72,
                  "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  dx = param[1].field_0.f;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e73,
                  "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e73,
                  "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  dy = param[2].field_0.f;
  if (numparam < 4) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1e74,
                    "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    iVar1 = (pVVar2->field_0).i;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1e74,
                    "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar1 = param[3].field_0.i;
  }
  u.Y._7_1_ = iVar1 != 0;
  AActor::Vec2Offset((AActor *)local_68,dx,dy,SUB81(this,0));
  if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1e75,
                    "int AF_AActor_Vec2Offset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetVector2(ret,(DVector2 *)local_68);
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Vec2Offset)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_BOOL_DEF(absolute);
	ACTION_RETURN_VEC2(self->Vec2Offset(x, y, absolute));
}